

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::InstallCompactionResults(DBImpl *this,CompactionState *compact)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  *pvVar6;
  undefined8 *in_RDX;
  VersionEdit *in_RSI;
  InternalKey *in_RDI;
  long in_FS_OFFSET;
  Mutex *in_stack_00000038;
  VersionEdit *in_stack_00000040;
  VersionSet *in_stack_00000048;
  Output *out;
  size_t i;
  int level;
  Compaction *in_stack_ffffffffffffff78;
  Compaction *this_00;
  size_type in_stack_ffffffffffffff80;
  vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  *this_01;
  Compaction *this_02;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 uVar7;
  vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  port::Mutex::AssertHeld((Mutex *)in_stack_ffffffffffffff78);
  this_02 = (Compaction *)
            (in_RSI->compact_pointers_).
            super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = Compaction::num_input_files(in_stack_ffffffffffffff78,0);
  uVar3 = Compaction::level(in_stack_ffffffffffffff78);
  uVar4 = Compaction::num_input_files(in_stack_ffffffffffffff78,0);
  iVar5 = Compaction::level(in_stack_ffffffffffffff78);
  this_00 = (Compaction *)in_RDX[7];
  Log((Logger *)this_02,"Compacted %d@%d + %d@%d files => %lld bytes",(ulong)uVar2,(ulong)uVar3,
      (ulong)uVar4,(ulong)(iVar5 + 1));
  uVar7 = *in_RDX;
  Compaction::edit(this_00);
  Compaction::AddInputDeletions(this_02,in_RSI);
  Compaction::level(this_00);
  local_30 = (vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
              *)0x0;
  while( true ) {
    this_01 = local_30;
    pvVar6 = (vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
              *)std::
                vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                ::size((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                        *)this_00);
    if (pvVar6 <= this_01) break;
    std::
    vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ::operator[](this_01,in_stack_ffffffffffffff80);
    Compaction::edit(this_00);
    VersionEdit::AddFile
              ((VersionEdit *)CONCAT44(uVar4,uVar3),(int)((ulong)uVar7 >> 0x20),
               CONCAT44(uVar2,in_stack_ffffffffffffffb0),(uint64_t)this_02,(InternalKey *)in_RSI,
               in_RDI);
    local_30 = (vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                *)((long)&(local_30->
                          super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  Compaction::edit(this_00);
  VersionSet::LogAndApply(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::InstallCompactionResults(CompactionState* compact) {
  mutex_.AssertHeld();
  Log(options_.info_log, "Compacted %d@%d + %d@%d files => %lld bytes",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1), compact->compaction->level() + 1,
      static_cast<long long>(compact->total_bytes));

  // Add compaction outputs
  compact->compaction->AddInputDeletions(compact->compaction->edit());
  const int level = compact->compaction->level();
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    const CompactionState::Output& out = compact->outputs[i];
    compact->compaction->edit()->AddFile(level + 1, out.number, out.file_size,
                                         out.smallest, out.largest);
  }
  return versions_->LogAndApply(compact->compaction->edit(), &mutex_);
}